

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O2

Fields * trieste::wf::ops::operator*(Fields *__return_storage_ptr__,Field *fst,Field *snd)

{
  long lVar1;
  initializer_list<trieste::wf::Field> __l;
  allocator_type local_51;
  Field local_50;
  Field local_30;
  
  Field::Field(&local_50,fst);
  Field::Field(&local_30,snd);
  __l._M_len = 2;
  __l._M_array = &local_50;
  CLI::std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::vector
            (&__return_storage_ptr__->fields,__l,&local_51);
  (__return_storage_ptr__->binding).def = (TokenDef *)Invalid;
  lVar1 = 0x28;
  do {
    CLI::std::_Vector_base<trieste::Token,_std::allocator<trieste::Token>_>::~_Vector_base
              ((_Vector_base<trieste::Token,_std::allocator<trieste::Token>_> *)
               ((long)&local_50.name.def + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

inline Fields operator*(Field&& fst, const Field& snd)
      {
        return Fields{std::vector<Field>{fst, snd}, Invalid};
      }